

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O1

void gpio_write(uint32_t address,uint16_t value)

{
  gbabus_t *pgVar1;
  byte bVar2;
  uint uVar3;
  char *__s;
  
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] [GPIO] gpio write 0x%04X to address 0x%08X\n",(ulong)value,address);
  }
  pgVar1 = bus;
  uVar3 = address & 0xf;
  bVar2 = (byte)value;
  if (uVar3 == 8) {
    bus->allow_gpio_read = (_Bool)(bVar2 & 1);
    if ((value & 1) == 0) {
      if (2 < gba_log_verbosity) {
        __s = "[DEBUG] [GPIO] GPIO is now UNREADABLE!";
        goto LAB_00120ea8;
      }
    }
    else if (2 < gba_log_verbosity) {
      __s = "[DEBUG] [GPIO] GPIO is now READABLE!";
LAB_00120ea8:
      puts(__s);
      return;
    }
  }
  else if (uVar3 == 6) {
    bVar2 = bVar2 & 0xf;
    bus->gpio_write_mask = bVar2;
    pgVar1->gpio_read_mask = bVar2 ^ 0xf;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] [GPIO] Set the read mask to 0x%X and the write mask to 0x%X\n",
             (ulong)(bVar2 ^ 0xf),(ulong)bVar2);
      return;
    }
  }
  else if (uVar3 == 4) {
    if (bus->gpio_device == RTC) {
      gba_rtc_write((gpio_port_t)(bVar2 & bus->gpio_write_mask),bus->gpio_write_mask);
      return;
    }
    gpio_write_cold_1();
    return;
  }
  return;
}

Assistant:

void gpio_write(word address, half value) {
    logdebug("[GPIO] gpio write 0x%04X to address 0x%08X", value, address);
    switch (address & 0xF) {
        case 0x4: // Data
            switch (bus->gpio_device) {
                case RTC: {
                    gpio_port_t port;
                    port.raw = value & bus->gpio_write_mask;
                    gba_rtc_write(port, bus->gpio_write_mask);
                    break;
                }
                default:
                    logfatal("Write to data port for unimplemented device %d", bus->gpio_device)
            }
            break;
        case 0x6:
            bus->gpio_write_mask = value    & 0b1111;
            bus->gpio_read_mask  = (~value) & 0b1111;
            logdebug("[GPIO] Set the read mask to 0x%X and the write mask to 0x%X", bus->gpio_read_mask, bus->gpio_write_mask);
            break;
        case 0x8:
            bus->allow_gpio_read = (value & 1) == 1;
            if (bus->allow_gpio_read) {
                logdebug("[GPIO] GPIO is now READABLE!");
            } else {
                logdebug("[GPIO] GPIO is now UNREADABLE!");
            }
            break;
    }
}